

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmarker.c
# Opt level: O2

void reset_marker_reader(j_decompress_ptr cinfo)

{
  jpeg_marker_reader *pjVar1;
  
  pjVar1 = cinfo->marker;
  cinfo->comp_info = (jpeg_component_info *)0x0;
  cinfo->input_scan_number = 0;
  cinfo->unread_marker = 0;
  pjVar1->saw_SOI = 0;
  pjVar1->saw_SOF = 0;
  pjVar1->discarded_bytes = 0;
  pjVar1[6].read_markers = (_func_int_j_decompress_ptr *)0x0;
  return;
}

Assistant:

METHODDEF(void)
reset_marker_reader (j_decompress_ptr cinfo)
{
  my_marker_ptr marker = (my_marker_ptr) cinfo->marker;

  cinfo->comp_info = NULL;		/* until allocated by get_sof */
  cinfo->input_scan_number = 0;		/* no SOS seen yet */
  cinfo->unread_marker = 0;		/* no pending marker */
  marker->pub.saw_SOI = FALSE;		/* set internal state too */
  marker->pub.saw_SOF = FALSE;
  marker->pub.discarded_bytes = 0;
  marker->cur_marker = NULL;
}